

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool Memory::Recycler::WBCheckIsRecyclerAddress(char *addr)

{
  HeapBlock *pHVar1;
  bool bVar2;
  Recycler *pRVar3;
  
  CCLock::Enter(&recyclerListLock.super_CCLock);
  if (recyclerList != (Recycler *)0x0) {
    pRVar3 = recyclerList;
    do {
      if ((char *)0xffff < addr) {
        pHVar1 = HeapBlockMap64::GetHeapBlock
                           (&pRVar3->heapBlockMap,(void *)((ulong)addr & 0xfffffffffffffff0));
        if (pHVar1 != (HeapBlock *)0x0) {
          bVar2 = true;
          goto LAB_0071945b;
        }
      }
      pRVar3 = pRVar3->next;
    } while (pRVar3 != (Recycler *)0x0);
  }
  bVar2 = false;
LAB_0071945b:
  CCLock::Leave(&recyclerListLock.super_CCLock);
  return bVar2;
}

Assistant:

bool
Recycler::WBCheckIsRecyclerAddress(char* addr)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            return true;
        }
        recycler = recycler->next;
    }
    return false;
}